

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sarimatest2.c
# Opt level: O0

int main(void)

{
  size_t __nmemb;
  sarima_object obj_00;
  double dVar1;
  sarima_object obj;
  size_t n_rows;
  double *column;
  double *amse;
  double *xpred;
  int Q;
  int D;
  int P;
  int s;
  int q;
  int p;
  double *inp;
  int local_18;
  int L;
  int d;
  int N;
  int i;
  
  N = 0;
  n_rows = 0;
  s = 0;
  local_18 = 1;
  P = 1;
  D = 0xc;
  Q = 0;
  xpred._4_4_ = 0;
  xpred._0_4_ = 1;
  inp._4_4_ = 5;
  amse = (double *)malloc(0x28);
  column = (double *)malloc((long)(int)inp._4_4_ << 3);
  __nmemb = read_csv_column("../data/ohlc_min.csv","Close",(double **)&n_rows);
  if (__nmemb == 0) {
    printf("Could not load data from file \'%s\'","../data/ohlc_min.csv");
    exit(100);
  }
  printf("Read %lu lines of \'%s\'\n",__nmemb,"../data/ohlc_min.csv");
  fflush(_stdout);
  _q = (double *)calloc(__nmemb,8);
  puts("Will take the logarithm");
  fflush(_stdout);
  for (d = 0; (ulong)(long)d < __nmemb; d = d + 1) {
    dVar1 = log(*(double *)(n_rows + (long)d * 8));
    _q[d] = dVar1;
  }
  puts("Initializing SARIMA");
  fflush(_stdout);
  obj_00 = sarima_init(s,local_18,P,D,Q,xpred._4_4_,(int)xpred,(int)__nmemb);
  sarima_setMethod(obj_00,0);
  puts("Will exec SARIMA");
  fflush(_stdout);
  sarima_exec(obj_00,_q);
  sarima_summary(obj_00);
  printf("Will predict %d values",(ulong)inp._4_4_);
  fflush(_stdout);
  sarima_predict(obj_00,_q,inp._4_4_,amse,column);
  printf("\n");
  printf("Predicted Values : ");
  for (d = 0; d < (int)inp._4_4_; d = d + 1) {
    printf("%g ",amse[d]);
  }
  printf("\n");
  printf("Standard Errors  : ");
  for (d = 0; d < (int)inp._4_4_; d = d + 1) {
    sqrt(column[d]);
    printf("%g ");
  }
  printf("\n");
  sarima_free(obj_00);
  free((void *)n_rows);
  free(_q);
  free(amse);
  free(column);
  return 0;
}

Assistant:

int main(void) {
	int i, N, d, L;
	double *inp;
	int p, q;
	int s, P, D, Q;
	double *xpred, *amse;
	double *column = (double*)NULL;
	size_t n_rows = 0;
	sarima_object obj;
	p = 0;
	d = 1;
	q = 1;
	s = 12;
	P = 0;
	D = 0; // OBS.: not enough data for seasonal differencing
	Q = 1;

	L = 5;

	xpred = (double*)malloc(sizeof(double)* L);
	amse = (double*)malloc(sizeof(double)* L);

	n_rows = read_csv_column(INPUT_FILE, "Close", &column);
	if (0 == n_rows) {
		printf("Could not load data from file '%s'", INPUT_FILE);
		exit(100);
	}

	printf("Read %lu lines of '%s'\n", n_rows, INPUT_FILE);
	fflush(stdout);

	inp = (double*)calloc(n_rows, sizeof(double));
	//wmean = mean(temp, N);

	puts("Will take the logarithm"); fflush(stdout);
	for (i = 0; i < n_rows; ++i) {
		inp[i] = log(column[i]);
		//printf("%g \n",inp[i]);
	}

	puts("Initializing SARIMA"); fflush(stdout);
	obj = sarima_init(p, d, q, s, P, D, Q, n_rows);
	sarima_setMethod(obj, 0); 
	/** \brief Method 0 ("MLE") is default so this step is unnecessary. 
	 * The method also accepts values 1 ("CSS") and 2 ("Box-Jenkins")
	 **/
	 
	// sarima_setOptMethod(obj, 7);
	/** \brief Method 7 ("BFGS with More Thuente Line Search") is 
	 * default so this step is unnecessary. The method also accepts 
	 * values 0,1,2,3,4,5,6. Check the documentation for details.
	 **/

	puts("Will exec SARIMA");  fflush(stdout);
	sarima_exec(obj, inp);
	sarima_summary(obj);
	
	// Predict the next 5 values using the obtained ARIMA model
	printf("Will predict %d values", L);  fflush(stdout);
	sarima_predict(obj, inp, L, xpred, amse);
	printf("\n");
	
	printf("Predicted Values : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", xpred[i]);
	}
	printf("\n");
	printf("Standard Errors  : ");
	for (i = 0; i < L; ++i) {
		printf("%g ", sqrt(amse[i]));
	}
	printf("\n");
	
	sarima_free(obj);
	free(column);
	free(inp);
	free(xpred);
	free(amse);
	
	return 0;
}